

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O0

void test_open_address_hashmap_simple_insert_and_query(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_err_t iVar2;
  char *expected;
  bool bVar3;
  char local_82 [8];
  char str_1 [10];
  ion_value_t value;
  char local_5e [8];
  char str [10];
  ion_status_t status;
  int i;
  ion_hashmap_t map;
  planck_unit_test_t *tc_local;
  
  initialize_hash_map_std_conditions((ion_hashmap_t *)&status.count);
  status.error = '\0';
  status._1_3_ = 0;
  while( true ) {
    if ((int)map.super.id <= (int)status._0_4_) {
      expected = (char *)malloc(10);
      status.error = '\0';
      status._1_3_ = 0;
      while( true ) {
        if ((int)map.super.id <= (int)status._0_4_) {
          if (expected != (char *)0x0) {
            free(expected);
          }
          iVar2 = oah_destroy((ion_hashmap_t *)&status.count);
          pVar1 = planck_unit_assert_true
                            (tc,(uint)(iVar2 == '\0'),0x165,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                             ,"condition was false, expected true");
          if (pVar1 == '\0') {
            longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
          }
          return;
        }
        str_1._2_8_ = oah_get((ion_hashmap_t *)&status.count,&status,expected);
        str[2] = (char)str_1._2_8_;
        bVar3 = str[2] == '\0';
        str._2_8_ = str_1._2_8_;
        pVar1 = planck_unit_assert_true
                          (tc,(uint)bVar3,0x156,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        pVar1 = planck_unit_assert_true
                          (tc,(uint)(str._6_4_ == 1),0x157,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar1 == '\0') break;
        sprintf(local_82,"%02i is key",(ulong)(uint)status._0_4_);
        pVar1 = planck_unit_assert_str_are_equal
                          (tc,expected,local_82,0x15d,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                          );
        if (pVar1 == '\0') {
          longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
        }
        status._0_4_ = status._0_4_ + 1;
      }
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    sprintf(local_5e,"%02i is key",(ulong)(uint)status._0_4_);
    str._2_8_ = oah_insert((ion_hashmap_t *)&status.count,&status,local_5e);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(str[2] == '\0'),0x14c,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(str._6_4_ == 1),0x14d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 == '\0') break;
    status._0_4_ = status._0_4_ + 1;
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_insert_and_query(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	ion_status_t	status;

	initialize_hash_map_std_conditions(&map);

	for (i = 0; i < map.map_size; i++) {
		/* build up the value */
		char str[10];

		sprintf(str, "%02i is key", i);
		/* this is will wrap the map */
		status = oah_insert(&map, (&i), str);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

	ion_value_t value;

	value = malloc(10);

	for (i = 0; i < map.map_size; i++) {
		status = oah_get(&map, &i, value);
		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

		/* build up expected value */
		char str[10];

		sprintf(str, "%02i is key", i);
		PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) value, str);
	}

	/* must free value after query */
	if (value != NULL) {
		free(value);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}